

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

int __thiscall S2Loop::CompareBoundary(S2Loop *this,S2Loop *b)

{
  bool bVar1;
  uint uVar2;
  S2Point *p;
  byte bVar3;
  CompareBoundaryRelation relation;
  S2LogMessage local_40;
  S2LogMessage local_30;
  
  if ((this->num_vertices_ == 1) && ((this->origin_inside_ & 1U) == 0)) {
    bVar3 = 1;
  }
  else {
    bVar3 = (b->origin_inside_ ^ 1U) & b->num_vertices_ == 1;
  }
  if (bVar3 != 0) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x4a7,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: !is_empty() && !b->is_empty() ",0x2c);
    if (bVar3 != 0) goto LAB_001892d4;
  }
  bVar3 = 0;
  if ((b->num_vertices_ == 1) && ((b->origin_inside_ & 1U) != 0)) {
    bVar3 = (byte)b->depth_ & 1;
  }
  if (bVar3 != 0) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x4a8,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: !b->is_full() || !b->is_hole() ",0x2d);
    if (bVar3 != 0) {
LAB_001892d4:
      abort();
    }
  }
  bVar1 = S2LatLngRect::Intersects(&this->bound_,&b->bound_);
  uVar2 = 0xffffffff;
  if (bVar1) {
    if ((this->num_vertices_ == 1) && ((this->origin_inside_ & 1U) != 0)) {
      uVar2 = 1;
    }
    else if ((b->num_vertices_ != 1) || ((b->origin_inside_ & 1U) == 0)) {
      relation.reverse_b_ = (bool)((byte)b->depth_ & 1);
      relation.super_LoopRelation._vptr_LoopRelation = (_func_int **)&PTR__LoopRelation_002c25f8;
      relation.found_shared_vertex_ = false;
      relation.contains_edge_ = false;
      relation.excludes_edge_ = false;
      bVar1 = HasCrossingRelation(this,b,&relation.super_LoopRelation);
      uVar2 = 0;
      if (!bVar1) {
        if (relation.found_shared_vertex_ == true) {
        }
        else {
          p = vertex(b,0);
          relation.contains_edge_ = Contains(this,p);
        }
        uVar2 = relation.contains_edge_ - 1 | 1;
      }
    }
  }
  return uVar2;
}

Assistant:

int S2Loop::CompareBoundary(const S2Loop* b) const {
  S2_DCHECK(!is_empty() && !b->is_empty());
  S2_DCHECK(!b->is_full() || !b->is_hole());

  // The bounds must intersect for containment or crossing.
  if (!bound_.Intersects(b->bound_)) return -1;

  // Full loops are handled as though the loop surrounded the entire sphere.
  if (is_full()) return 1;
  if (b->is_full()) return -1;

  // Check whether there are any edge crossings, and also check the loop
  // relationship at any shared vertices.
  CompareBoundaryRelation relation(b->is_hole());
  if (HasCrossingRelation(*this, *b, &relation)) return 0;
  if (relation.found_shared_vertex()) {
    return relation.contains_edge() ? 1 : -1;
  }

  // There are no edge intersections or shared vertices, so we can check
  // whether A contains an arbitrary vertex of B.
  return Contains(b->vertex(0)) ? 1 : -1;
}